

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O2

void re_set_trans(re_context *ctx,re_state_id id,re_state_id dest_id,char ch)

{
  re_tuple *prVar1;
  
  prVar1 = ctx->tuple_arr + id;
  if (ctx->tuple_arr[id].next_state_1 != -1) {
    prVar1->next_state_2 = dest_id;
    return;
  }
  if ((prVar1->flags & 6) == 0) {
    prVar1->ch = ch;
  }
  prVar1->next_state_1 = dest_id;
  return;
}

Assistant:

static void re_set_trans(re_context *ctx,
                         re_state_id id, re_state_id dest_id, char ch)
{
    re_tuple *tuple;
    
    /* 
     *   get the tuple containing the transitions for this state ID - the
     *   state ID is the index of the state's transition tuple in the
     *   array 
     */
    tuple = &ctx->tuple_arr[id];

    /*
     *   If the first state pointer hasn't been set yet, set it to the new
     *   destination.  Otherwise, set the second state pointer.
     *   
     *   Only set the character on setting the first state.  When setting
     *   the second state, we must assume that the character for the state
     *   has already been set, since any given state can have only one
     *   character setting.  
     */
    if (tuple->next_state_1 == RE_STATE_INVALID)
    {
        /* 
         *   set the character ID, unless the state has been marked with a
         *   special flag which indicates that the character value has
         *   another meaning (in particular, a group marker) 
         */
        if (!(tuple->flags & (RE_STATE_GROUP_BEGIN | RE_STATE_GROUP_END)))
            tuple->ch = ch;

        /* set the first transition */
        tuple->next_state_1 = dest_id;
    }
    else
    {
        /* set only the second transition state - don't set the character */
        tuple->next_state_2 = dest_id;
    }
}